

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalize.cc
# Opt level: O0

bool woff2::NormalizeGlyphs(Font *font)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  int num_glyphs_00;
  Table *pTVar4;
  Table *this;
  Table *this_00;
  ulong uVar5;
  reference pvVar6;
  double dVar7;
  size_t max_normalized_glyf_size;
  int num_glyphs;
  int index_fmt;
  Table *loca_table;
  Table *glyf_table;
  Table *head_table;
  Font *font_local;
  
  pTVar4 = Font::FindTable(font,0x68656164);
  this = Font::FindTable(font,0x676c7966);
  this_00 = Font::FindTable(font,0x6c6f6361);
  if (pTVar4 == (Table *)0x0) {
    font_local._7_1_ = false;
  }
  else if ((this_00 == (Table *)0x0) && (this == (Table *)0x0)) {
    font_local._7_1_ = true;
  }
  else if ((this == (Table *)0x0) == (this_00 == (Table *)0x0)) {
    bVar2 = Font::Table::IsReused(this_00);
    bVar3 = Font::Table::IsReused(this);
    if (bVar2 == bVar3) {
      bVar2 = Font::Table::IsReused(this_00);
      if (bVar2) {
        font_local._7_1_ = true;
      }
      else {
        bVar1 = pTVar4->data[0x33];
        num_glyphs_00 = NumGlyphs(font);
        dVar7 = (double)this->length * 1.1 + (double)(num_glyphs_00 * 2);
        uVar5 = (ulong)dVar7;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  (&this->buffer,uVar5 | (long)(dVar7 - 9.223372036854776e+18) & (long)uVar5 >> 0x3f
                  );
        bVar2 = anon_unknown_3::WriteNormalizedLoca((uint)bVar1,num_glyphs_00,font);
        if (!bVar2) {
          if (bVar1 != 0) {
            return false;
          }
          bVar2 = anon_unknown_3::WriteNormalizedLoca(1,num_glyphs_00,font);
          if (!bVar2) {
            return false;
          }
          pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             (&pTVar4->buffer,0x33);
          *pvVar6 = '\x01';
        }
        font_local._7_1_ = true;
      }
    }
    else {
      font_local._7_1_ = false;
    }
  }
  else {
    font_local._7_1_ = false;
  }
  return font_local._7_1_;
}

Assistant:

bool NormalizeGlyphs(Font* font) {
  Font::Table* head_table = font->FindTable(kHeadTableTag);
  Font::Table* glyf_table = font->FindTable(kGlyfTableTag);
  Font::Table* loca_table = font->FindTable(kLocaTableTag);
  if (head_table == NULL) {
    return FONT_COMPRESSION_FAILURE();
  }
  // If you don't have glyf/loca this transform isn't very interesting
  if (loca_table == NULL && glyf_table == NULL) {
    return true;
  }
  // It would be best if you didn't have just one of glyf/loca
  if ((glyf_table == NULL) != (loca_table == NULL)) {
    return FONT_COMPRESSION_FAILURE();
  }
  // Must share neither or both loca & glyf
  if (loca_table->IsReused() != glyf_table->IsReused()) {
    return FONT_COMPRESSION_FAILURE();
  }
  if (loca_table->IsReused()) {
    return true;
  }

  int index_fmt = head_table->data[51];
  int num_glyphs = NumGlyphs(*font);

  // We need to allocate a bit more than its original length for the normalized
  // glyf table, since it can happen that the glyphs in the original table are
  // 2-byte aligned, while in the normalized table they are 4-byte aligned.
  // That gives a maximum of 2 bytes increase per glyph. However, there is no
  // theoretical guarantee that the total size of the flags plus the coordinates
  // is the smallest possible in the normalized version, so we have to allow
  // some general overhead.
  // TODO(user) Figure out some more precise upper bound on the size of
  // the overhead.
  size_t max_normalized_glyf_size = 1.1 * glyf_table->length + 2 * num_glyphs;

  glyf_table->buffer.resize(max_normalized_glyf_size);

  // if we can't write a loca using short's (index_fmt 0)
  // try again using longs (index_fmt 1)
  if (!WriteNormalizedLoca(index_fmt, num_glyphs, font)) {
    if (index_fmt != 0) {
      return FONT_COMPRESSION_FAILURE();
    }

    // Rewrite loca with 4-byte entries & update head to match
    index_fmt = 1;
    if (!WriteNormalizedLoca(index_fmt, num_glyphs, font)) {
      return FONT_COMPRESSION_FAILURE();
    }
    head_table->buffer[51] = 1;
  }

  return true;
}